

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::ExclusiveJoinPromiseNode::ExclusiveJoinPromiseNode
          (ExclusiveJoinPromiseNode *this,OwnPromiseNode *left,OwnPromiseNode *right,
          SourceLocation location)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_20;
  
  (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR_destroy_00672fe8;
  local_20.ptr = left->ptr;
  left->ptr = (PromiseNode *)0x0;
  Branch::Branch(&this->left,this,(PromiseNode *)&local_20,location);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_20);
  local_28.ptr = right->ptr;
  right->ptr = (PromiseNode *)0x0;
  Branch::Branch(&this->right,this,(PromiseNode *)&local_28,location);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28);
  (this->onReadyEvent).event = (Event *)0x0;
  return;
}

Assistant:

ExclusiveJoinPromiseNode::ExclusiveJoinPromiseNode(
    OwnPromiseNode left, OwnPromiseNode right, SourceLocation location)
    : left(*this, kj::mv(left), location), right(*this, kj::mv(right), location) {}